

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::node::get_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  function<void_(const_libtorrent::dht::item_&,_bool)> *out;
  span<const_char> in;
  undefined1 local_89;
  shared_ptr<libtorrent::dht::get_item> ta;
  char hex_key [65];
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    out = f;
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)hex_key;
      in.m_ptr = (char *)0x20;
      aux::to_hex((aux *)pk,in,(char *)out);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting get for [ key: %s ]",hex_key);
    }
  }
  hex_key[0x10] = '\0';
  hex_key[0x11] = '\0';
  hex_key[0x12] = '\0';
  hex_key[0x13] = '\0';
  hex_key[0x14] = '\0';
  hex_key[0x15] = '\0';
  hex_key[0x16] = '\0';
  hex_key[0x17] = '\0';
  hex_key[0x18] = '\0';
  hex_key[0x19] = '\0';
  hex_key[0x1a] = '\0';
  hex_key[0x1b] = '\0';
  hex_key[0x1c] = '\0';
  hex_key[0x1d] = '\0';
  hex_key[0x1e] = '\0';
  hex_key[0x1f] = '\0';
  hex_key[0] = '\0';
  hex_key[1] = '\0';
  hex_key[2] = '\0';
  hex_key[3] = '\0';
  hex_key[4] = '\0';
  hex_key[5] = '\0';
  hex_key[6] = '\0';
  hex_key[7] = '\0';
  hex_key[8] = '\0';
  hex_key[9] = '\0';
  hex_key[10] = '\0';
  hex_key[0xb] = '\0';
  hex_key[0xc] = '\0';
  hex_key[0xd] = '\0';
  hex_key[0xe] = '\0';
  hex_key[0xf] = '\0';
  ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::dht::get_item,std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::function<void(libtorrent::dht::item_const&,bool)>&,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            (&ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(get_item **)&ta,(allocator<libtorrent::dht::get_item> *)&local_89,this,pk
             ,salt,f,(function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                      *)hex_key);
  std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<libtorrent::dht::get_item,libtorrent::dht::get_item>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&ta,
             ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (hex_key._16_8_ != 0) {
    (*(code *)hex_key._16_8_)(hex_key,hex_key,3);
  }
  (*((ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  if (ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void node::get_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, bool)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting get for [ key: %s ]", hex_key);
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt, f
		, find_data::nodes_callback());
	ta->start();
}